

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O3

ares_status_t ares_uri_write_fragment(ares_uri_t *uri,ares_buf_t *buf)

{
  ares_status_t aVar1;
  size_t sVar2;
  
  sVar2 = ares_strlen(uri->fragment);
  if (sVar2 == 0) {
    aVar1 = ARES_SUCCESS;
  }
  else {
    aVar1 = ares_buf_append_byte(buf,'#');
    if (aVar1 == ARES_SUCCESS) {
      aVar1 = ares_uri_encode_buf(buf,uri->fragment,ares_uri_chis_fragment);
      return aVar1;
    }
  }
  return aVar1;
}

Assistant:

static ares_status_t ares_uri_write_fragment(const ares_uri_t *uri,
                                             ares_buf_t       *buf)
{
  ares_status_t status;

  if (!ares_strlen(uri->fragment)) {
    return ARES_SUCCESS;
  }

  status = ares_buf_append_byte(buf, '#');
  if (status != ARES_SUCCESS) {
    return status;
  }

  status = ares_uri_encode_buf(buf, uri->fragment, ares_uri_chis_fragment);
  if (status != ARES_SUCCESS) {
    return status;
  }

  return ARES_SUCCESS;
}